

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O0

void absl::lts_20250127::container_internal::
     IsDestructionTrivial<std::allocator<google::protobuf::Symbol>,google::protobuf::Symbol>(void)

{
  bool result;
  
  return;
}

Assistant:

constexpr auto IsDestructionTrivial() {
  constexpr bool result =
      std::is_trivially_destructible<ValueType>::value &&
      std::is_same<typename absl::allocator_traits<
                       Allocator>::template rebind_alloc<char>,
                   std::allocator<char>>::value;
  return std::integral_constant<bool, result>();
}